

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmines.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 local_d00 [8];
  tuple<int,_int> pos;
  exception *inner_error;
  ofstream report_file;
  string firstline;
  istringstream err_msg_stream;
  int i;
  string err_report;
  exception *e;
  char **ppcStack_3e0;
  int argp_state;
  argp argp;
  argp_option options [19];
  char **argv_local;
  int argc_local;
  
  memcpy(&argp.argp_domain,&DAT_0013b760,0x390);
  argp.options = (argp_option *)parse_opt;
  argp.parser = (argp_parser_t)0x0;
  argp.args_doc =
       "Play Minesweeper on the terminal.\vControls:\nMovement    WASD, Arrow Keys, vimlike (HJKL)\nFlag Mine   F\nOpen Field  Space\nQuit        Q"
  ;
  argp.doc = (char *)0x0;
  argp.children = (argp_child *)0x0;
  argp.help_filter = (_func_char_ptr_int_char_ptr_void_ptr *)0x0;
  ppcStack_3e0 = &argp.argp_domain;
  iVar1 = argp_parse(&stack0xfffffffffffffc20,argc,argv,0,0);
  run();
  Display::getConsolePosition((Display *)local_d00,1,1);
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {
    struct argp_option options[] = {
        {0, 0, 0, 0, "Field Size", 10},
        {"width", 'w', "WIDTH", 0, "width of the minefield, default: 10", 10},
        {0, 'x', 0, OPTION_ALIAS, 0, 10},
        {"height", 'h', "HEIGHT", 0, "height of the minefield, default: 10", 10},
        {0, 'y', 0, OPTION_ALIAS, 0, 10},
        {"fullscreen", 'f', 0, 0, "use full screen size", 10},
        {0, 0, 0, OPTION_DOC, "note: use either fullscreen or specify size explicitly (not both)", 10},

        {0, 0, 0, 0, "Mines", 20},
        {"mine-count", 'c', "NUM", 0, "number of mines to be placed", 20},
        {"count", 0, 0, OPTION_ALIAS | OPTION_HIDDEN, 0, 20},
        {"mine-density", 'd', "PERCENTAGE", 0, "density of mines to be placed, default: 16%. Specify as number between 0 and 100 (for percentages), omit '\%' charater", 20},
        {"density", 0, 0, OPTION_ALIAS | OPTION_HIDDEN, 0, 20},
        {0, 0, 0, OPTION_DOC, "note: use either mine density or specify mine count explicitly (not both)", 20},

        {0, 0, 0, 0, "Other", 30},
        {"autodiscover-only", 'a', 0, 0, "if enabled: fields can only be opened using autodiscover feature (see man)", 30},
        {"seed", 's', "SEED", 0, "seed for field generation, suitable seed will be chosen automatically", 30},

        {"license", 1337, 0, 0, "display the license", -1},
        {"authors", 1338, 0, 0, "display the authors", -1},

        {0, 0, 0, 0, 0, 0}
    };
    struct argp argp = {options, parse_opt, 0, "Play Minesweeper on the terminal.\vControls:\nMovement    WASD, Arrow Keys, vimlike (HJKL)\nFlag Mine   F\nOpen Field  Space\nQuit        Q", 0, 0, 0};

    int argp_state = argp_parse(&argp, argc, argv, 0, 0, 0);

    try{
        run();
    } catch (std::exception& e) {
        std::string err_report = "";
        err_report += "Error Report\n\n";
        err_report += "=====================================\n";
        err_report += "Please send this to \"" + std::string(TerminateMines_BUG_ADDRESS) + "\"\n";
        err_report += "Thank you!\n";
        err_report += "=====================================\n\n";
        err_report += "Message:\n";
        err_report += "  " + std::string(e.what()) + "\n\n";
        err_report += "Settings:\n";
        err_report += "  Width, Height:     " + std::to_string(opts.width) + ", " + std::to_string(opts.height) + "\n";
        err_report += "  Mine Count:        " + std::to_string(opts.mine_count) + "\n";
        err_report += "  Seed:              " + std::to_string(opts.seed) + "\n";
        err_report += "  Autodiscover only: ";
        if (opts.autodiscover_only) {
            err_report += "enabled\n";
        } else {
            err_report += "disabled\n";
        }
        err_report += "  Fullscreen:        ";
        if (opts.fullscreen) {
            err_report += "enabled\n";
        } else {
            err_report += "disabled\n";
        }
        err_report += "  Args:             ";
        for (int i = 1; i < argc; i++) {
            err_report += " " + std::string(argv[i]);
        }
        err_report += "\n\n";

        err_report += "Terminal:\n";
        err_report += "  Lines: " + std::to_string(LINES) + "\n";
        err_report += "  Cols:  " + std::to_string(COLS) + "\n";

        err_report += "\n";

        err_report += "Version\n";
        err_report += "  Version Number: " + std::string(TerminateMines_VERSION_MAJOR) + "." + std::string(TerminateMines_VERSION_MINOR) + "\n";
        err_report += "  Git Commit:     " + std::string(TerminateMines_GIT_COMMIT_HASH) + "\n";

        // end window here, as COLS ans ROWS are read during creation of error report
        endwin();

        std::cerr << "Unfourtunately an Error occured:" << std::endl;
        // only print first line:
        std::istringstream err_msg_stream(e.what());
        std::string firstline;
        std::getline(err_msg_stream, firstline);
        std::cerr << "  " << firstline << std::endl << std::endl;

        try{
            std::ofstream report_file;
            report_file.open(CRASH_REPORT_FILE);

            if (! report_file.good()) {
                throw std::runtime_error("Can't open file \"" + std::string(CRASH_REPORT_FILE) + "\"");
            }
            report_file << err_report;
            
            std::cerr << "A crash report has been written to the file \"" << CRASH_REPORT_FILE <<"\"" << std::endl;
            std::cerr << "If you think that error should not be popping up, please send an email to \"" << TerminateMines_BUG_ADDRESS << "\" and attach the file \"" << CRASH_REPORT_FILE << "\"." << std::endl;
            std::cerr << "Thank you!" << std::endl;
        } catch (std::exception& inner_error) {
            std::cerr << "The error report could not be written to a file due to:" << std::endl;
            std::cerr << "  " << inner_error.what() << std::endl << std::endl;
            std::cerr << "========================" << std::endl;
            std::cerr << err_report << std::endl;
            std::cerr << "========================" << std::endl;
            std::cerr << "Please send this crash report to \"" << TerminateMines_BUG_ADDRESS << "\"." << std::endl;
            std::cerr << "Thank you!" << std::endl;
        }
    }

    auto pos = Display::getConsolePosition(1, 1);

    return argp_state;
}